

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O3

void __thiscall
tcu::x11::XcbWindow::XcbWindow
          (XcbWindow *this,XcbDisplay *display,int width,int height,xcb_visualid_t *visual)

{
  xcb_connection_t *pxVar1;
  xcb_screen_t *pxVar2;
  xcb_window_t xVar3;
  xcb_colormap_t xVar4;
  undefined4 uVar5;
  void *ptr;
  xcb_visualid_t *pxVar6;
  uint32_t values [2];
  
  WindowBase::WindowBase(&this->super_WindowBase);
  (this->super_WindowBase)._vptr_WindowBase = (_func_int **)&PTR__XcbWindow_003e5ea8;
  this->m_display = display;
  pxVar1 = display->m_connection;
  xVar3 = xcb_generate_id(pxVar1);
  this->m_window = xVar3;
  xVar4 = xcb_generate_id(pxVar1);
  this->m_colormap = xVar4;
  pxVar2 = this->m_display->m_screen;
  pxVar6 = &pxVar2->root_visual;
  if (visual != (xcb_visualid_t *)0x0) {
    pxVar6 = visual;
  }
  values[0] = pxVar2->white_pixel;
  values[1] = 0x408000;
  xcb_create_window(pxVar1,0,this->m_window,display->m_screen->root,0,0,width & 0xffff,
                    height & 0xffff,10,1,*pxVar6,0x802,values);
  xcb_create_colormap(pxVar1,0,this->m_colormap,this->m_window,*pxVar6);
  uVar5 = xcb_alloc_color(pxVar1,this->m_colormap,0xffff,0,0);
  ptr = (void *)xcb_alloc_color_reply(pxVar1,uVar5,0);
  deFree(ptr);
  xcb_flush(pxVar1);
  return;
}

Assistant:

XcbWindow::XcbWindow (XcbDisplay& display, int width, int height, xcb_visualid_t* visual)
	: WindowBase	()
	, m_display		(display)
{
	xcb_connection_t*	connection = m_display.getConnection();
	uint32_t			values[2];
	m_window	= xcb_generate_id(connection);
	m_colormap	= xcb_generate_id(connection);

	if (visual == DE_NULL)
		visual = &m_display.getScreen()->root_visual;

	values[0] = m_display.getScreen()->white_pixel;
	values[1] = XCB_EVENT_MASK_EXPOSURE | XCB_EVENT_MASK_PROPERTY_CHANGE;

	xcb_create_window	(
							connection,								// Connection
							XCB_COPY_FROM_PARENT,					// depth (same as root)
							m_window,								// window Id
							display.getScreen()->root,				// parent window
							0, 0,									// x, y
							static_cast<uint16_t >(width),			// width
							static_cast<uint16_t >(height),			// height
							10,										// border_width
							XCB_WINDOW_CLASS_INPUT_OUTPUT,			// class
							*visual,								// visual
							XCB_CW_BACK_PIXEL | XCB_CW_EVENT_MASK,	// masks
							values									//not used yet
						);

	xcb_create_colormap	(
							connection,
							XCB_COLORMAP_ALLOC_NONE,
							m_colormap,
							m_window,
							*visual
						);

	xcb_alloc_color_reply_t* rep = xcb_alloc_color_reply(connection, xcb_alloc_color(connection, m_colormap, 65535, 0, 0), NULL);
	deFree(rep);
	xcb_flush (connection);
}